

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

bool __thiscall
TPZMatrix<std::complex<float>_>::SolveEigensystemJacobi
          (TPZMatrix<std::complex<float>_> *this,int64_t *numiterations,REAL *tol,
          TPZVec<std::complex<float>_> *Eigenvalues,TPZFMatrix<std::complex<float>_> *Eigenvectors)

{
  double dVar1;
  double dVar2;
  complex<float> val_00;
  int iVar3;
  complex<float> *pcVar4;
  complex<float> *pcVar5;
  TPZVec<std::complex<float>_> *in_RCX;
  double *in_RDX;
  long *in_RSI;
  TPZBaseMatrix *in_RDI;
  long *in_R8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  complex<float> val;
  int64_t i_9;
  complex<float> exp_1;
  int64_t i_8;
  int64_t i_7;
  REAL norm2;
  int64_t i_6;
  double difTemp;
  double dif;
  int64_t count;
  int64_t i_5;
  int64_t i_4;
  REAL norm1;
  int64_t i_3;
  int64_t i_2;
  complex<float> exp;
  complex<float> answ;
  TPZFNMatrix<9,_std::complex<float>_> Matrix_1;
  int64_t i_1;
  int64_t eigen;
  TPZFNMatrix<3,_std::complex<float>_> VecIni_cp;
  TPZFNMatrix<3,_std::complex<float>_> VecIni;
  bool result;
  int64_t j;
  int64_t i;
  TPZFNMatrix<9,_std::complex<float>_> Matrix;
  int64_t size;
  REAL tolerance;
  int64_t NumIt;
  TPZVec<std::complex<float>_> *in_stack_fffffffffffff808;
  undefined4 in_stack_fffffffffffff810;
  undefined4 in_stack_fffffffffffff814;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffff818;
  undefined4 in_stack_fffffffffffff820;
  float in_stack_fffffffffffff824;
  undefined4 in_stack_fffffffffffff828;
  undefined4 in_stack_fffffffffffff82c;
  undefined4 in_stack_fffffffffffff830;
  undefined4 in_stack_fffffffffffff834;
  undefined4 in_stack_fffffffffffff840;
  undefined4 in_stack_fffffffffffff844;
  TPZFMatrix<std::complex<float>_> *in_stack_fffffffffffff848;
  TPZFNMatrix<9,_std::complex<float>_> *in_stack_fffffffffffff850;
  undefined4 in_stack_fffffffffffff858;
  undefined4 in_stack_fffffffffffff85c;
  undefined4 in_stack_fffffffffffff860;
  undefined4 in_stack_fffffffffffff864;
  TPZVec<std::complex<float>_> *in_stack_fffffffffffff898;
  complex<float> in_stack_fffffffffffff8a0;
  undefined4 in_stack_fffffffffffff8a8;
  float in_stack_fffffffffffff8ac;
  complex<float> local_590;
  long local_588;
  complex<float> local_560;
  _ComplexT local_558;
  long local_550;
  double local_548;
  double local_540;
  long local_538;
  double local_530;
  long local_528;
  double local_520;
  double local_518;
  long local_510;
  complex<float> local_508;
  _ComplexT local_500;
  long local_4f8;
  double local_4f0;
  double local_4e8;
  long local_4e0;
  double local_4d8;
  complex<float> local_4d0 [4];
  long local_4b0;
  double local_4a8;
  complex<float> local_4a0 [4];
  long local_480;
  double local_470;
  complex<float> local_468;
  _ComplexT local_460;
  complex<float> local_2e0;
  long local_2d8;
  long local_2d0;
  complex<float> local_2c8 [23];
  complex<float> local_210 [23];
  undefined4 local_154;
  undefined1 local_14d;
  _ComplexT local_140;
  long local_138;
  long local_130;
  int64_t local_48;
  double local_40;
  long local_38;
  long *local_30;
  TPZVec<std::complex<float>_> *local_28;
  byte local_1;
  
  local_38 = *in_RSI;
  local_40 = *in_RDX;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_48 = TPZBaseMatrix::Rows(in_RDI);
  TPZFNMatrix<9,_std::complex<float>_>::TPZFNMatrix
            (in_stack_fffffffffffff850,(int64_t)in_stack_fffffffffffff848,
             CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  for (local_130 = 0; local_130 < local_48; local_130 = local_130 + 1) {
    for (local_138 = 0; local_138 < local_48; local_138 = local_138 + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_130,local_138);
      local_140 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      pcVar4 = TPZFMatrix<std::complex<float>_>::operator()
                         ((TPZFMatrix<std::complex<float>_> *)
                          CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                          CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                          CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
      pcVar4->_M_value = local_140;
    }
  }
  local_14d = SolveEigenvaluesJacobi
                        ((TPZMatrix<std::complex<float>_> *)
                         CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),
                         (int64_t *)in_stack_fffffffffffff818,
                         (REAL *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                         in_stack_fffffffffffff808);
  if ((bool)local_14d) {
    std::complex<float>::complex(local_210,0.0,0.0);
    TPZFNMatrix<3,_std::complex<float>_>::TPZFNMatrix
              ((TPZFNMatrix<3,_std::complex<float>_> *)
               CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
               CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
               (int64_t)in_stack_fffffffffffff850,(complex<float> *)in_stack_fffffffffffff848);
    std::complex<float>::complex(local_2c8,0.0,0.0);
    TPZFNMatrix<3,_std::complex<float>_>::TPZFNMatrix
              ((TPZFNMatrix<3,_std::complex<float>_> *)
               CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
               CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
               (int64_t)in_stack_fffffffffffff850,(complex<float> *)in_stack_fffffffffffff848);
    (**(code **)(*local_30 + 0x68))(local_30,local_48);
    (**(code **)(*local_30 + 0x78))();
    for (local_2d0 = 0; local_2d0 < local_48; local_2d0 = local_2d0 + 1) {
      for (local_2d8 = 0; local_2d8 < local_48; local_2d8 = local_2d8 + 1) {
        iVar3 = rand();
        std::complex<float>::complex(&local_2e0,(float)iVar3,0.0);
        TPZFMatrix<std::complex<float>_>::PutVal
                  ((TPZFMatrix<std::complex<float>_> *)
                   CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                   CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                   CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),
                   (complex<float> *)in_stack_fffffffffffff818);
      }
      TPZFMatrix<std::complex<float>_>::TPZFMatrix
                ((TPZFMatrix<std::complex<float>_> *)in_stack_fffffffffffff8a0._M_value,
                 (TPZMatrix<std::complex<float>_> *)in_stack_fffffffffffff898);
      TPZFNMatrix<9,_std::complex<float>_>::TPZFNMatrix
                (in_stack_fffffffffffff850,in_stack_fffffffffffff848);
      TPZFMatrix<std::complex<float>_>::~TPZFMatrix((TPZFMatrix<std::complex<float>_> *)0x12aaddc);
      pcVar4 = TPZVec<std::complex<float>_>::operator[](local_28,local_2d0);
      local_460 = pcVar4->_M_value;
      std::complex<float>::complex(&local_468,1e-05,0.0);
      val_00._M_value._4_4_ = in_stack_fffffffffffff8ac;
      val_00._M_value._0_4_ = in_stack_fffffffffffff8a8;
      ReturnNearestValue(val_00,in_stack_fffffffffffff898,in_stack_fffffffffffff8a0);
      TPZVec<std::complex<float>_>::operator[](local_28,local_2d0);
      std::operator-((complex<float> *)in_stack_fffffffffffff808,(complex<float> *)0x12aaea6);
      local_470 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
      dVar1 = fabs(local_470);
      if (SUB84(dVar1,0) <= 1e-05) {
        for (local_4b0 = 0; local_4b0 < local_48; local_4b0 = local_4b0 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_4b0);
          TPZVec<std::complex<float>_>::operator[](local_28,local_2d0);
          std::complex<float>::complex(local_4d0,0.01,0.0);
          std::operator-((complex<float> *)in_stack_fffffffffffff808,(complex<float> *)0x12ab19f);
          std::operator-((complex<float> *)in_stack_fffffffffffff808,(complex<float> *)0x12ab1cf);
          TPZFMatrix<std::complex<float>_>::PutVal
                    ((TPZFMatrix<std::complex<float>_> *)
                     CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                     CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                     CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),
                     (complex<float> *)in_stack_fffffffffffff818);
        }
      }
      else {
        for (local_480 = 0; local_480 < local_48; local_480 = local_480 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_480);
          TPZVec<std::complex<float>_>::operator[](local_28,local_2d0);
          local_4a8 = local_470;
          dVar1 = fabs(local_470);
          std::complex<float>::complex(local_4a0,SUB84(dVar1,0) * 0.01,0.0);
          std::operator-((complex<float> *)in_stack_fffffffffffff808,(complex<float> *)0x12ab004);
          std::operator-((complex<float> *)in_stack_fffffffffffff808,(complex<float> *)0x12ab034);
          TPZFMatrix<std::complex<float>_>::PutVal
                    ((TPZFMatrix<std::complex<float>_> *)
                     CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                     CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                     CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),
                     (complex<float> *)in_stack_fffffffffffff818);
        }
      }
      local_4d8 = 0.0;
      for (local_4e0 = 0; local_4e0 < local_48; local_4e0 = local_4e0 + 1) {
        pcVar4 = TPZFMatrix<std::complex<float>_>::operator()
                           ((TPZFMatrix<std::complex<float>_> *)
                            CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                            CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                            CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
        local_4e8 = (double)pcVar4->_M_value;
        dVar1 = fabs(local_4e8);
        pcVar4 = TPZFMatrix<std::complex<float>_>::operator()
                           ((TPZFMatrix<std::complex<float>_> *)
                            CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                            CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                            CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
        local_4f0 = (double)pcVar4->_M_value;
        dVar2 = fabs(local_4f0);
        local_4d8 = (double)(SUB84(dVar1,0) * SUB84(dVar2,0)) + local_4d8;
      }
      local_4d8 = sqrt(local_4d8);
      for (local_4f8 = 0; local_4f8 < local_48; local_4f8 = local_4f8 + 1) {
        TPZFMatrix<std::complex<float>_>::operator()
                  ((TPZFMatrix<std::complex<float>_> *)
                   CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                   CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                   CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
        std::complex<float>::complex(&local_508,(float)local_4d8,0.0);
        std::operator/((complex<float> *)in_stack_fffffffffffff808,(complex<float> *)0x12ab3cf);
        local_500 = CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
        pcVar4 = TPZFMatrix<std::complex<float>_>::operator()
                           ((TPZFMatrix<std::complex<float>_> *)
                            CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                            CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                            CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
        pcVar4->_M_value = local_500;
      }
      local_518 = 10.0;
      local_520 = 0.0;
      for (local_510 = 0; local_40 < local_518 && local_510 <= local_38; local_510 = local_510 + 1)
      {
        for (local_528 = 0; local_528 < local_48; local_528 = local_528 + 1) {
          pcVar4 = TPZFMatrix<std::complex<float>_>::operator()
                             ((TPZFMatrix<std::complex<float>_> *)
                              CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                              CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                              CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
          pcVar5 = TPZFMatrix<std::complex<float>_>::operator()
                             ((TPZFMatrix<std::complex<float>_> *)
                              CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                              CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                              CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
          pcVar5->_M_value = pcVar4->_M_value;
        }
        Solve_LU((TPZMatrix<std::complex<float>_> *)
                 CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),
                 in_stack_fffffffffffff818);
        local_530 = 0.0;
        for (local_538 = 0; local_538 < local_48; local_538 = local_538 + 1) {
          pcVar4 = TPZFMatrix<std::complex<float>_>::operator()
                             ((TPZFMatrix<std::complex<float>_> *)
                              CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                              CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                              CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
          local_540 = (double)pcVar4->_M_value;
          dVar1 = fabs(local_540);
          pcVar4 = TPZFMatrix<std::complex<float>_>::operator()
                             ((TPZFMatrix<std::complex<float>_> *)
                              CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                              CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                              CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
          local_548 = (double)pcVar4->_M_value;
          dVar2 = fabs(local_548);
          in_stack_fffffffffffff8ac = SUB84(dVar2,0);
          local_530 = (double)(SUB84(dVar1,0) * in_stack_fffffffffffff8ac) + local_530;
        }
        local_530 = sqrt(local_530);
        local_520 = 0.0;
        for (local_550 = 0; local_550 < local_48; local_550 = local_550 + 1) {
          in_stack_fffffffffffff8a0._M_value =
               (_ComplexT)
               TPZFMatrix<std::complex<float>_>::operator()
                         ((TPZFMatrix<std::complex<float>_> *)
                          CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                          CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                          CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
          std::complex<float>::complex(&local_560,(float)local_530,0.0);
          std::operator/((complex<float> *)in_stack_fffffffffffff808,(complex<float> *)0x12ab700);
          local_558 = CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
          pcVar4 = TPZFMatrix<std::complex<float>_>::operator()
                             ((TPZFMatrix<std::complex<float>_> *)
                              CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                              CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                              CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
          pcVar4->_M_value = local_558;
          TPZFMatrix<std::complex<float>_>::operator()
                    ((TPZFMatrix<std::complex<float>_> *)
                     CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                     CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                     CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
          TPZFMatrix<std::complex<float>_>::operator()
                    ((TPZFMatrix<std::complex<float>_> *)
                     CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                     CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                     CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
          std::operator-((complex<float> *)in_stack_fffffffffffff808,(complex<float> *)0x12ab79a);
          in_stack_fffffffffffff850 =
               (TPZFNMatrix<9,_std::complex<float>_> *)
               TPZFMatrix<std::complex<float>_>::operator()
                         ((TPZFMatrix<std::complex<float>_> *)
                          CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                          CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                          CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
          in_stack_fffffffffffff848 =
               (TPZFMatrix<std::complex<float>_> *)
               TPZFMatrix<std::complex<float>_>::operator()
                         ((TPZFMatrix<std::complex<float>_> *)
                          CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                          CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                          CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
          std::operator-((complex<float> *)in_stack_fffffffffffff808,(complex<float> *)0x12ab7fe);
          std::operator*((complex<float> *)in_stack_fffffffffffff808,(complex<float> *)0x12ab828);
          in_stack_fffffffffffff828 = extraout_XMM0_Da_03;
          in_stack_fffffffffffff82c = extraout_XMM0_Db_03;
          in_stack_fffffffffffff830 = extraout_XMM0_Dc;
          in_stack_fffffffffffff834 = extraout_XMM0_Dd;
          dVar1 = fabs((double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
          in_stack_fffffffffffff824 = SUB84(dVar1,0);
          local_520 = (double)in_stack_fffffffffffff824 + local_520;
        }
        local_518 = sqrt(local_520);
      }
      for (local_588 = 0; local_588 < local_48; local_588 = local_588 + 1) {
        in_stack_fffffffffffff818 =
             (TPZFMatrix<std::complex<float>_> *)
             TPZFMatrix<std::complex<float>_>::operator()
                       ((TPZFMatrix<std::complex<float>_> *)
                        CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                        CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                        CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
        local_590._M_value =
             (_ComplexT)
             (in_stack_fffffffffffff818->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
             super_TPZSavable._vptr_TPZSavable;
        dVar1 = fabs((double)local_590._M_value);
        if (SUB84(dVar1,0) < 1e-05) {
          std::complex<float>::operator=(&local_590,0.0);
        }
        in_stack_fffffffffffff808 =
             (TPZVec<std::complex<float>_> *)
             TPZFMatrix<std::complex<float>_>::operator()
                       ((TPZFMatrix<std::complex<float>_> *)
                        CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830),
                        CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                        CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
        in_stack_fffffffffffff808->_vptr_TPZVec = (_func_int **)local_590._M_value;
      }
      TPZFNMatrix<9,_std::complex<float>_>::~TPZFNMatrix
                ((TPZFNMatrix<9,_std::complex<float>_> *)0x12ab9c4);
    }
    local_1 = 1;
    local_154 = 1;
    TPZFNMatrix<3,_std::complex<float>_>::~TPZFNMatrix
              ((TPZFNMatrix<3,_std::complex<float>_> *)0x12ab9fd);
    TPZFNMatrix<3,_std::complex<float>_>::~TPZFNMatrix
              ((TPZFNMatrix<3,_std::complex<float>_> *)0x12aba0a);
  }
  else {
    local_1 = 0;
    local_154 = 1;
  }
  TPZFNMatrix<9,_std::complex<float>_>::~TPZFNMatrix
            ((TPZFNMatrix<9,_std::complex<float>_> *)0x12aba35);
  return (bool)(local_1 & 1);
}

Assistant:

bool TPZMatrix<TVar>::SolveEigensystemJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> & Eigenvalues, TPZFMatrix<TVar> & Eigenvectors) const{
	
	int64_t NumIt = numiterations;
	REAL tolerance = tol;
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols())
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false)
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	const int64_t size = this->Rows();
	
	/** Making a copy of this */
	TPZFNMatrix<9,TVar> Matrix(size,size); //fast constructor in case of this is a stress or strain tensor.
	for(int64_t i = 0; i < size; i++) for(int64_t j = 0; j < size; j++) Matrix(i,j) = this->Get(i,j);
	
	/** Compute Eigenvalues *//////////////////////////////////////
	bool result = Matrix.SolveEigenvaluesJacobi(numiterations, tol, &Eigenvalues);
	if (result == false) return false;
	
	/** Compute Eigenvectors *//////////////////////////////////////
	TPZFNMatrix<3, TVar> VecIni(size,1,0.), VecIni_cp(size,1,0.);
	
	Eigenvectors.Resize(size, size);
	Eigenvectors.Zero();
	for(int64_t eigen = 0; eigen < size; eigen++)
	{
        for(int64_t i = 0; i < size; i++) VecIni.PutVal(i,0,rand());
		
        TPZFNMatrix<9,TVar> Matrix(*this);
		
        TVar answ = ReturnNearestValue(Eigenvalues[eigen], Eigenvalues,((TVar)1.E-5));
        TVar exp = answ - Eigenvalues[eigen];
        if((REAL)(fabs(exp)) > 1.E-5)
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (TVar)(Eigenvalues[eigen] - (TVar)(0.01 * fabs(exp))) );
        }
        else
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (Eigenvalues[eigen] - TVar(0.01)) );
        }
		
        /** Normalizing Initial Eigenvec */
        REAL norm1 = 0.;
        for(int64_t i = 0; i < size; i++) norm1 += fabs(VecIni(i,0)) * fabs(VecIni(i,0)); norm1 = sqrt(norm1);
        for(int64_t i = 0; i < size; i++) VecIni(i,0) = VecIni(i,0)/(TVar)norm1;
		
        int64_t count = 0;
        double dif = 10., difTemp = 0.;
		
        while(dif > tolerance && count <= NumIt)
        {
			for(int64_t i = 0; i < size; i++) VecIni_cp(i,0) = VecIni(i,0);
			
			/** Estimating Eigenvec */
			Matrix.Solve_LU(&VecIni);
			
			/** Normalizing Final Eigenvec */
			REAL norm2 = 0.;
			for(int64_t i = 0; i < size; i++) norm2 += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
			norm2 = sqrt(norm2);
			
			difTemp = 0.;
			for(int64_t i = 0; i < size; i++)
			{
                VecIni(i,0) = VecIni(i,0)/(TVar)norm2;
                TVar exp = (VecIni_cp(i,0) - VecIni(i,0)) * (VecIni_cp(i,0) - VecIni(i,0));
                difTemp += fabs(exp);
			}
			dif = sqrt(difTemp);
			count++;
        }
		
        /** Copy values from AuxVector to Eigenvectors */
        for(int64_t i = 0; i < size; i++)
        {
			TVar val = VecIni(i,0);
			if((REAL)(fabs(val)) < 1.E-5) val = 0.;
			Eigenvectors(eigen,i) = val;
        }
		
#ifdef PZDEBUG2
        double norm = 0.;
        for(int64_t i = 0; i < size; i++) norm += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
        if (fabs(norm - 1.) > 1.e-10)
        {
            PZError << __PRETTY_FUNCTION__ << endl;
        }
        if(count > NumIt-1)// O metodo nao convergiu !!!
        {
            PZError << __PRETTY_FUNCTION__ << endl;
#ifdef PZ_LOG
            {
                std::stringstream sout;
                Print("Matrix for SolveEigensystemJacobi did not converge",sout);
                LOGPZ_DEBUG(logger,sout.str());
            }
#endif
        }
#endif
	}
	
	return true;
	
}